

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_value.cpp
# Opt level: O3

void duckdb::ListValueFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  byte bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  DataChunk *pDVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  reference pvVar5;
  long lVar6;
  Vector *pVVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  reference pvVar9;
  _Head_base<0UL,_unsigned_long_*,_false> _Var10;
  undefined8 uVar11;
  ulong uVar12;
  idx_t i;
  size_type sVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  undefined8 *puVar17;
  ulong uVar18;
  idx_t idx_in_entry;
  Vector *pVVar19;
  size_type sVar20;
  undefined8 *puVar21;
  string_t sVar22;
  undefined1 auVar23 [16];
  idx_t offset_sum;
  value_type list;
  vector<unsigned_long,_true> col_offsets;
  UnifiedVectorFormat *local_168;
  Vector *local_160;
  long local_158;
  Vector *local_150;
  undefined8 *local_148;
  ulong local_140;
  undefined8 *local_138;
  Vector *local_130;
  DataChunk *local_128;
  Vector *local_120;
  long local_118;
  long local_110;
  UnifiedVectorFormat *local_108;
  unsigned_long local_100;
  undefined8 local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *ap_Stack_f0 [6];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  vector<unsigned_long,_true> local_88 [3];
  long local_40;
  long local_38;
  
  duckdb::Vector::SetVectorType((VectorType)result);
  if (*(long *)(args + 8) == *(long *)args) {
    puVar21 = *(undefined8 **)(result + 0x20);
    *puVar21 = 0;
    puVar21[1] = 0;
    return;
  }
  sVar13 = 0;
  do {
    pvVar5 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,sVar13);
    if (*pvVar5 != (value_type)0x2) {
      duckdb::Vector::SetVectorType((VectorType)result);
    }
    sVar13 = sVar13 + 1;
  } while (sVar13 < (ulong)((*(long *)(args + 8) - *(long *)args >> 3) * 0x4ec4ec4ec4ec4ec5));
  lVar6 = duckdb::ListVector::GetEntry(result);
  bVar1 = *(byte *)(lVar6 + 9);
  local_128 = args;
  local_120 = result;
  if (bVar1 < 200) {
    switch(bVar1) {
    case 1:
    case 3:
      local_160 = *(Vector **)args;
      local_140 = *(ulong *)(args + 8);
      lVar14 = ((long)(local_140 - (long)local_160) >> 3) * 0x4ec4ec4ec4ec4ec5;
      duckdb::ListVector::Reserve(result,*(long *)(args + 0x18) * lVar14);
      local_130 = *(Vector **)(result + 0x20);
      pVVar7 = (Vector *)duckdb::ListVector::GetEntry(result);
      lVar6 = *(long *)(pVVar7 + 0x20);
      FlatVector::VerifyFlatVector(pVVar7);
      duckdb::DataChunk::ToUnifiedFormat();
      uVar18 = *(ulong *)(args + 0x18);
      if (uVar18 == 0) {
        uVar18 = 0;
      }
      else {
        local_150 = pVVar7 + 0x30;
        local_138 = (undefined8 *)(lVar14 + (ulong)(lVar14 == 0));
        puVar21 = (undefined8 *)0x0;
        uVar12 = 0;
        local_158 = lVar14;
        do {
          if ((Vector *)local_140 != local_160) {
            lVar14 = 0x10;
            puVar17 = local_138;
            local_148 = puVar21;
            do {
              uVar18 = uVar12;
              if (**(long **)(local_168 + lVar14 + -0x10) != 0) {
                uVar18 = (ulong)*(uint *)(**(long **)(local_168 + lVar14 + -0x10) + uVar12 * 4);
              }
              if ((*(long *)(local_168 + lVar14) == 0) ||
                 ((*(ulong *)(*(long *)(local_168 + lVar14) + (uVar18 >> 6) * 8) >> (uVar18 & 0x3f)
                  & 1) != 0)) {
                *(undefined1 *)(lVar6 + (long)puVar21) =
                     *(undefined1 *)(*(long *)(local_168 + lVar14 + -8) + uVar18);
              }
              else {
                _Var10._M_head_impl = *(unsigned_long **)(pVVar7 + 0x28);
                if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                  local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start = *(pointer *)(pVVar7 + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_f8,(unsigned_long *)local_88);
                  p_Var4 = ap_Stack_f0[0];
                  uVar11 = local_f8;
                  local_f8 = 0;
                  ap_Stack_f0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38);
                  *(undefined8 *)(pVVar7 + 0x30) = uVar11;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38) = p_Var4;
                  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                     ap_Stack_f0[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_f0[0]);
                  }
                  pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                           operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                       *)local_150);
                  _Var10._M_head_impl =
                       (pTVar8->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)(pVVar7 + 0x28) = _Var10._M_head_impl;
                }
                bVar1 = (byte)puVar21 & 0x3f;
                _Var10._M_head_impl[(ulong)puVar21 >> 6] =
                     _Var10._M_head_impl[(ulong)puVar21 >> 6] &
                     (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
              }
              puVar21 = (undefined8 *)((long)puVar21 + 1);
              lVar14 = lVar14 + 0x48;
              puVar17 = (undefined8 *)((long)puVar17 + -1);
            } while (puVar17 != (undefined8 *)0x0);
            uVar18 = *(ulong *)(local_128 + 0x18);
            puVar21 = local_148;
            lVar14 = local_158;
          }
          *(ulong *)((long)local_130 + uVar12 * 0x10) = uVar12 * lVar14;
          *(long *)((long)local_130 + 8U + uVar12 * 0x10) = lVar14;
          uVar12 = uVar12 + 1;
          puVar21 = (undefined8 *)((long)puVar21 + lVar14);
        } while (uVar12 < uVar18);
      }
      duckdb::ListVector::SetListSize(local_120,uVar18 * lVar14);
      break;
    case 2:
      local_160 = *(Vector **)args;
      local_140 = *(ulong *)(args + 8);
      lVar14 = ((long)(local_140 - (long)local_160) >> 3) * 0x4ec4ec4ec4ec4ec5;
      duckdb::ListVector::Reserve(result,*(long *)(args + 0x18) * lVar14);
      local_130 = *(Vector **)(result + 0x20);
      pVVar7 = (Vector *)duckdb::ListVector::GetEntry(result);
      lVar6 = *(long *)(pVVar7 + 0x20);
      FlatVector::VerifyFlatVector(pVVar7);
      duckdb::DataChunk::ToUnifiedFormat();
      uVar18 = *(ulong *)(args + 0x18);
      if (uVar18 == 0) {
        uVar18 = 0;
      }
      else {
        local_150 = pVVar7 + 0x30;
        local_138 = (undefined8 *)(lVar14 + (ulong)(lVar14 == 0));
        puVar21 = (undefined8 *)0x0;
        uVar12 = 0;
        local_158 = lVar14;
        do {
          if ((Vector *)local_140 != local_160) {
            lVar14 = 0x10;
            puVar17 = local_138;
            local_148 = puVar21;
            do {
              uVar18 = uVar12;
              if (**(long **)(local_168 + lVar14 + -0x10) != 0) {
                uVar18 = (ulong)*(uint *)(**(long **)(local_168 + lVar14 + -0x10) + uVar12 * 4);
              }
              if ((*(long *)(local_168 + lVar14) == 0) ||
                 ((*(ulong *)(*(long *)(local_168 + lVar14) + (uVar18 >> 6) * 8) >> (uVar18 & 0x3f)
                  & 1) != 0)) {
                *(undefined1 *)(lVar6 + (long)puVar21) =
                     *(undefined1 *)(*(long *)(local_168 + lVar14 + -8) + uVar18);
              }
              else {
                _Var10._M_head_impl = *(unsigned_long **)(pVVar7 + 0x28);
                if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                  local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start = *(pointer *)(pVVar7 + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_f8,(unsigned_long *)local_88);
                  p_Var4 = ap_Stack_f0[0];
                  uVar11 = local_f8;
                  local_f8 = 0;
                  ap_Stack_f0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38);
                  *(undefined8 *)(pVVar7 + 0x30) = uVar11;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38) = p_Var4;
                  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                     ap_Stack_f0[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_f0[0]);
                  }
                  pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                           operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                       *)local_150);
                  _Var10._M_head_impl =
                       (pTVar8->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)(pVVar7 + 0x28) = _Var10._M_head_impl;
                }
                bVar1 = (byte)puVar21 & 0x3f;
                _Var10._M_head_impl[(ulong)puVar21 >> 6] =
                     _Var10._M_head_impl[(ulong)puVar21 >> 6] &
                     (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
              }
              puVar21 = (undefined8 *)((long)puVar21 + 1);
              lVar14 = lVar14 + 0x48;
              puVar17 = (undefined8 *)((long)puVar17 + -1);
            } while (puVar17 != (undefined8 *)0x0);
            uVar18 = *(ulong *)(local_128 + 0x18);
            puVar21 = local_148;
            lVar14 = local_158;
          }
          *(ulong *)((long)local_130 + uVar12 * 0x10) = uVar12 * lVar14;
          *(long *)((long)local_130 + 8U + uVar12 * 0x10) = lVar14;
          uVar12 = uVar12 + 1;
          puVar21 = (undefined8 *)((long)puVar21 + lVar14);
        } while (uVar12 < uVar18);
      }
      duckdb::ListVector::SetListSize(local_120,uVar18 * lVar14);
      break;
    case 4:
      local_160 = *(Vector **)args;
      local_140 = *(ulong *)(args + 8);
      lVar14 = ((long)(local_140 - (long)local_160) >> 3) * 0x4ec4ec4ec4ec4ec5;
      duckdb::ListVector::Reserve(result,*(long *)(args + 0x18) * lVar14);
      local_130 = *(Vector **)(result + 0x20);
      pVVar7 = (Vector *)duckdb::ListVector::GetEntry(result);
      lVar6 = *(long *)(pVVar7 + 0x20);
      FlatVector::VerifyFlatVector(pVVar7);
      duckdb::DataChunk::ToUnifiedFormat();
      uVar18 = *(ulong *)(args + 0x18);
      if (uVar18 == 0) {
        uVar18 = 0;
      }
      else {
        local_150 = pVVar7 + 0x30;
        local_138 = (undefined8 *)(lVar14 + (ulong)(lVar14 == 0));
        puVar21 = (undefined8 *)0x0;
        uVar12 = 0;
        local_158 = lVar14;
        do {
          if ((Vector *)local_140 != local_160) {
            lVar14 = 8;
            puVar17 = local_138;
            local_148 = puVar21;
            do {
              uVar18 = uVar12;
              if (**(long **)(local_168 + lVar14 * 2 + -0x10) != 0) {
                uVar18 = (ulong)*(uint *)(**(long **)(local_168 + lVar14 * 2 + -0x10) + uVar12 * 4);
              }
              if ((*(long *)(local_168 + lVar14 * 2) == 0) ||
                 ((*(ulong *)(*(long *)(local_168 + lVar14 * 2) + (uVar18 >> 6) * 8) >>
                   (uVar18 & 0x3f) & 1) != 0)) {
                *(undefined2 *)(lVar6 + (long)puVar21 * 2) =
                     *(undefined2 *)(*(long *)(local_168 + lVar14 * 2 + -8) + uVar18 * 2);
              }
              else {
                _Var10._M_head_impl = *(unsigned_long **)(pVVar7 + 0x28);
                if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                  local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start = *(pointer *)(pVVar7 + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_f8,(unsigned_long *)local_88);
                  p_Var4 = ap_Stack_f0[0];
                  uVar11 = local_f8;
                  local_f8 = 0;
                  ap_Stack_f0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38);
                  *(undefined8 *)(pVVar7 + 0x30) = uVar11;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38) = p_Var4;
                  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                     ap_Stack_f0[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_f0[0]);
                  }
                  pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                           operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                       *)local_150);
                  _Var10._M_head_impl =
                       (pTVar8->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)(pVVar7 + 0x28) = _Var10._M_head_impl;
                }
                bVar1 = (byte)puVar21 & 0x3f;
                _Var10._M_head_impl[(ulong)puVar21 >> 6] =
                     _Var10._M_head_impl[(ulong)puVar21 >> 6] &
                     (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
              }
              puVar21 = (undefined8 *)((long)puVar21 + 1);
              lVar14 = lVar14 + 0x24;
              puVar17 = (undefined8 *)((long)puVar17 + -1);
            } while (puVar17 != (undefined8 *)0x0);
            uVar18 = *(ulong *)(local_128 + 0x18);
            puVar21 = local_148;
            lVar14 = local_158;
          }
          *(ulong *)((long)local_130 + uVar12 * 0x10) = uVar12 * lVar14;
          *(long *)((long)local_130 + 8U + uVar12 * 0x10) = lVar14;
          uVar12 = uVar12 + 1;
          puVar21 = (undefined8 *)((long)puVar21 + lVar14);
        } while (uVar12 < uVar18);
      }
      duckdb::ListVector::SetListSize(local_120,uVar18 * lVar14);
      break;
    case 5:
      local_160 = *(Vector **)args;
      local_140 = *(ulong *)(args + 8);
      lVar14 = ((long)(local_140 - (long)local_160) >> 3) * 0x4ec4ec4ec4ec4ec5;
      duckdb::ListVector::Reserve(result,*(long *)(args + 0x18) * lVar14);
      local_130 = *(Vector **)(result + 0x20);
      pVVar7 = (Vector *)duckdb::ListVector::GetEntry(result);
      lVar6 = *(long *)(pVVar7 + 0x20);
      FlatVector::VerifyFlatVector(pVVar7);
      duckdb::DataChunk::ToUnifiedFormat();
      uVar18 = *(ulong *)(args + 0x18);
      if (uVar18 == 0) {
        uVar18 = 0;
      }
      else {
        local_150 = pVVar7 + 0x30;
        local_138 = (undefined8 *)(lVar14 + (ulong)(lVar14 == 0));
        puVar21 = (undefined8 *)0x0;
        uVar12 = 0;
        local_158 = lVar14;
        do {
          if ((Vector *)local_140 != local_160) {
            lVar14 = 8;
            puVar17 = local_138;
            local_148 = puVar21;
            do {
              uVar18 = uVar12;
              if (**(long **)(local_168 + lVar14 * 2 + -0x10) != 0) {
                uVar18 = (ulong)*(uint *)(**(long **)(local_168 + lVar14 * 2 + -0x10) + uVar12 * 4);
              }
              if ((*(long *)(local_168 + lVar14 * 2) == 0) ||
                 ((*(ulong *)(*(long *)(local_168 + lVar14 * 2) + (uVar18 >> 6) * 8) >>
                   (uVar18 & 0x3f) & 1) != 0)) {
                *(undefined2 *)(lVar6 + (long)puVar21 * 2) =
                     *(undefined2 *)(*(long *)(local_168 + lVar14 * 2 + -8) + uVar18 * 2);
              }
              else {
                _Var10._M_head_impl = *(unsigned_long **)(pVVar7 + 0x28);
                if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                  local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start = *(pointer *)(pVVar7 + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_f8,(unsigned_long *)local_88);
                  p_Var4 = ap_Stack_f0[0];
                  uVar11 = local_f8;
                  local_f8 = 0;
                  ap_Stack_f0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38);
                  *(undefined8 *)(pVVar7 + 0x30) = uVar11;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38) = p_Var4;
                  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                     ap_Stack_f0[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_f0[0]);
                  }
                  pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                           operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                       *)local_150);
                  _Var10._M_head_impl =
                       (pTVar8->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)(pVVar7 + 0x28) = _Var10._M_head_impl;
                }
                bVar1 = (byte)puVar21 & 0x3f;
                _Var10._M_head_impl[(ulong)puVar21 >> 6] =
                     _Var10._M_head_impl[(ulong)puVar21 >> 6] &
                     (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
              }
              puVar21 = (undefined8 *)((long)puVar21 + 1);
              lVar14 = lVar14 + 0x24;
              puVar17 = (undefined8 *)((long)puVar17 + -1);
            } while (puVar17 != (undefined8 *)0x0);
            uVar18 = *(ulong *)(local_128 + 0x18);
            puVar21 = local_148;
            lVar14 = local_158;
          }
          *(ulong *)((long)local_130 + uVar12 * 0x10) = uVar12 * lVar14;
          *(long *)((long)local_130 + 8U + uVar12 * 0x10) = lVar14;
          uVar12 = uVar12 + 1;
          puVar21 = (undefined8 *)((long)puVar21 + lVar14);
        } while (uVar12 < uVar18);
      }
      duckdb::ListVector::SetListSize(local_120,uVar18 * lVar14);
      break;
    case 6:
      local_160 = *(Vector **)args;
      local_140 = *(ulong *)(args + 8);
      lVar14 = ((long)(local_140 - (long)local_160) >> 3) * 0x4ec4ec4ec4ec4ec5;
      duckdb::ListVector::Reserve(result,*(long *)(args + 0x18) * lVar14);
      local_130 = *(Vector **)(result + 0x20);
      pVVar7 = (Vector *)duckdb::ListVector::GetEntry(result);
      lVar6 = *(long *)(pVVar7 + 0x20);
      FlatVector::VerifyFlatVector(pVVar7);
      duckdb::DataChunk::ToUnifiedFormat();
      uVar18 = *(ulong *)(args + 0x18);
      if (uVar18 == 0) {
        uVar18 = 0;
      }
      else {
        local_150 = pVVar7 + 0x30;
        local_138 = (undefined8 *)(lVar14 + (ulong)(lVar14 == 0));
        puVar21 = (undefined8 *)0x0;
        uVar12 = 0;
        local_158 = lVar14;
        do {
          if ((Vector *)local_140 != local_160) {
            lVar14 = 4;
            puVar17 = local_138;
            local_148 = puVar21;
            do {
              uVar18 = uVar12;
              if (**(long **)(local_168 + lVar14 * 4 + -0x10) != 0) {
                uVar18 = (ulong)*(uint *)(**(long **)(local_168 + lVar14 * 4 + -0x10) + uVar12 * 4);
              }
              if ((*(long *)(local_168 + lVar14 * 4) == 0) ||
                 ((*(ulong *)(*(long *)(local_168 + lVar14 * 4) + (uVar18 >> 6) * 8) >>
                   (uVar18 & 0x3f) & 1) != 0)) {
                *(undefined4 *)(lVar6 + (long)puVar21 * 4) =
                     *(undefined4 *)(*(long *)(local_168 + lVar14 * 4 + -8) + uVar18 * 4);
              }
              else {
                _Var10._M_head_impl = *(unsigned_long **)(pVVar7 + 0x28);
                if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                  local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start = *(pointer *)(pVVar7 + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_f8,(unsigned_long *)local_88);
                  p_Var4 = ap_Stack_f0[0];
                  uVar11 = local_f8;
                  local_f8 = 0;
                  ap_Stack_f0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38);
                  *(undefined8 *)(pVVar7 + 0x30) = uVar11;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38) = p_Var4;
                  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                     ap_Stack_f0[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_f0[0]);
                  }
                  pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                           operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                       *)local_150);
                  _Var10._M_head_impl =
                       (pTVar8->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)(pVVar7 + 0x28) = _Var10._M_head_impl;
                }
                bVar1 = (byte)puVar21 & 0x3f;
                _Var10._M_head_impl[(ulong)puVar21 >> 6] =
                     _Var10._M_head_impl[(ulong)puVar21 >> 6] &
                     (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
              }
              puVar21 = (undefined8 *)((long)puVar21 + 1);
              lVar14 = lVar14 + 0x12;
              puVar17 = (undefined8 *)((long)puVar17 + -1);
            } while (puVar17 != (undefined8 *)0x0);
            uVar18 = *(ulong *)(local_128 + 0x18);
            puVar21 = local_148;
            lVar14 = local_158;
          }
          *(ulong *)((long)local_130 + uVar12 * 0x10) = uVar12 * lVar14;
          *(long *)((long)local_130 + 8U + uVar12 * 0x10) = lVar14;
          uVar12 = uVar12 + 1;
          puVar21 = (undefined8 *)((long)puVar21 + lVar14);
        } while (uVar12 < uVar18);
      }
      duckdb::ListVector::SetListSize(local_120,uVar18 * lVar14);
      break;
    case 7:
      local_160 = *(Vector **)args;
      local_140 = *(ulong *)(args + 8);
      lVar14 = ((long)(local_140 - (long)local_160) >> 3) * 0x4ec4ec4ec4ec4ec5;
      duckdb::ListVector::Reserve(result,*(long *)(args + 0x18) * lVar14);
      local_130 = *(Vector **)(result + 0x20);
      pVVar7 = (Vector *)duckdb::ListVector::GetEntry(result);
      lVar6 = *(long *)(pVVar7 + 0x20);
      FlatVector::VerifyFlatVector(pVVar7);
      duckdb::DataChunk::ToUnifiedFormat();
      uVar18 = *(ulong *)(args + 0x18);
      if (uVar18 == 0) {
        uVar18 = 0;
      }
      else {
        local_150 = pVVar7 + 0x30;
        local_138 = (undefined8 *)(lVar14 + (ulong)(lVar14 == 0));
        puVar21 = (undefined8 *)0x0;
        uVar12 = 0;
        local_158 = lVar14;
        do {
          if ((Vector *)local_140 != local_160) {
            lVar14 = 4;
            puVar17 = local_138;
            local_148 = puVar21;
            do {
              uVar18 = uVar12;
              if (**(long **)(local_168 + lVar14 * 4 + -0x10) != 0) {
                uVar18 = (ulong)*(uint *)(**(long **)(local_168 + lVar14 * 4 + -0x10) + uVar12 * 4);
              }
              if ((*(long *)(local_168 + lVar14 * 4) == 0) ||
                 ((*(ulong *)(*(long *)(local_168 + lVar14 * 4) + (uVar18 >> 6) * 8) >>
                   (uVar18 & 0x3f) & 1) != 0)) {
                *(undefined4 *)(lVar6 + (long)puVar21 * 4) =
                     *(undefined4 *)(*(long *)(local_168 + lVar14 * 4 + -8) + uVar18 * 4);
              }
              else {
                _Var10._M_head_impl = *(unsigned_long **)(pVVar7 + 0x28);
                if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                  local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start = *(pointer *)(pVVar7 + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_f8,(unsigned_long *)local_88);
                  p_Var4 = ap_Stack_f0[0];
                  uVar11 = local_f8;
                  local_f8 = 0;
                  ap_Stack_f0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38);
                  *(undefined8 *)(pVVar7 + 0x30) = uVar11;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38) = p_Var4;
                  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                     ap_Stack_f0[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_f0[0]);
                  }
                  pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                           operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                       *)local_150);
                  _Var10._M_head_impl =
                       (pTVar8->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)(pVVar7 + 0x28) = _Var10._M_head_impl;
                }
                bVar1 = (byte)puVar21 & 0x3f;
                _Var10._M_head_impl[(ulong)puVar21 >> 6] =
                     _Var10._M_head_impl[(ulong)puVar21 >> 6] &
                     (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
              }
              puVar21 = (undefined8 *)((long)puVar21 + 1);
              lVar14 = lVar14 + 0x12;
              puVar17 = (undefined8 *)((long)puVar17 + -1);
            } while (puVar17 != (undefined8 *)0x0);
            uVar18 = *(ulong *)(local_128 + 0x18);
            puVar21 = local_148;
            lVar14 = local_158;
          }
          *(ulong *)((long)local_130 + uVar12 * 0x10) = uVar12 * lVar14;
          *(long *)((long)local_130 + 8U + uVar12 * 0x10) = lVar14;
          uVar12 = uVar12 + 1;
          puVar21 = (undefined8 *)((long)puVar21 + lVar14);
        } while (uVar12 < uVar18);
      }
      duckdb::ListVector::SetListSize(local_120,uVar18 * lVar14);
      break;
    case 8:
      local_160 = *(Vector **)args;
      local_140 = *(ulong *)(args + 8);
      lVar14 = ((long)(local_140 - (long)local_160) >> 3) * 0x4ec4ec4ec4ec4ec5;
      duckdb::ListVector::Reserve(result,*(long *)(args + 0x18) * lVar14);
      local_130 = *(Vector **)(result + 0x20);
      pVVar7 = (Vector *)duckdb::ListVector::GetEntry(result);
      lVar6 = *(long *)(pVVar7 + 0x20);
      FlatVector::VerifyFlatVector(pVVar7);
      duckdb::DataChunk::ToUnifiedFormat();
      uVar18 = *(ulong *)(args + 0x18);
      if (uVar18 == 0) {
        uVar18 = 0;
      }
      else {
        local_150 = pVVar7 + 0x30;
        local_138 = (undefined8 *)(lVar14 + (ulong)(lVar14 == 0));
        puVar21 = (undefined8 *)0x0;
        uVar12 = 0;
        local_158 = lVar14;
        do {
          if ((Vector *)local_140 != local_160) {
            lVar14 = 2;
            puVar17 = local_138;
            local_148 = puVar21;
            do {
              uVar18 = uVar12;
              if (**(long **)(local_168 + lVar14 * 8 + -0x10) != 0) {
                uVar18 = (ulong)*(uint *)(**(long **)(local_168 + lVar14 * 8 + -0x10) + uVar12 * 4);
              }
              if ((*(long *)(local_168 + lVar14 * 8) == 0) ||
                 ((*(ulong *)(*(long *)(local_168 + lVar14 * 8) + (uVar18 >> 6) * 8) >>
                   (uVar18 & 0x3f) & 1) != 0)) {
                *(undefined8 *)(lVar6 + (long)puVar21 * 8) =
                     *(undefined8 *)(*(long *)(local_168 + lVar14 * 8 + -8) + uVar18 * 8);
              }
              else {
                _Var10._M_head_impl = *(unsigned_long **)(pVVar7 + 0x28);
                if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                  local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start = *(pointer *)(pVVar7 + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_f8,(unsigned_long *)local_88);
                  p_Var4 = ap_Stack_f0[0];
                  uVar11 = local_f8;
                  local_f8 = 0;
                  ap_Stack_f0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38);
                  *(undefined8 *)(pVVar7 + 0x30) = uVar11;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38) = p_Var4;
                  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                     ap_Stack_f0[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_f0[0]);
                  }
                  pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                           operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                       *)local_150);
                  _Var10._M_head_impl =
                       (pTVar8->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)(pVVar7 + 0x28) = _Var10._M_head_impl;
                }
                bVar1 = (byte)puVar21 & 0x3f;
                _Var10._M_head_impl[(ulong)puVar21 >> 6] =
                     _Var10._M_head_impl[(ulong)puVar21 >> 6] &
                     (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
              }
              puVar21 = (undefined8 *)((long)puVar21 + 1);
              lVar14 = lVar14 + 9;
              puVar17 = (undefined8 *)((long)puVar17 + -1);
            } while (puVar17 != (undefined8 *)0x0);
            uVar18 = *(ulong *)(local_128 + 0x18);
            puVar21 = local_148;
            lVar14 = local_158;
          }
          *(ulong *)((long)local_130 + uVar12 * 0x10) = uVar12 * lVar14;
          *(long *)((long)local_130 + 8U + uVar12 * 0x10) = lVar14;
          uVar12 = uVar12 + 1;
          puVar21 = (undefined8 *)((long)puVar21 + lVar14);
        } while (uVar12 < uVar18);
      }
      duckdb::ListVector::SetListSize(local_120,uVar18 * lVar14);
      break;
    case 9:
      local_160 = *(Vector **)args;
      local_140 = *(ulong *)(args + 8);
      lVar14 = ((long)(local_140 - (long)local_160) >> 3) * 0x4ec4ec4ec4ec4ec5;
      duckdb::ListVector::Reserve(result,*(long *)(args + 0x18) * lVar14);
      local_130 = *(Vector **)(result + 0x20);
      pVVar7 = (Vector *)duckdb::ListVector::GetEntry(result);
      lVar6 = *(long *)(pVVar7 + 0x20);
      FlatVector::VerifyFlatVector(pVVar7);
      duckdb::DataChunk::ToUnifiedFormat();
      uVar18 = *(ulong *)(args + 0x18);
      if (uVar18 == 0) {
        uVar18 = 0;
      }
      else {
        local_150 = pVVar7 + 0x30;
        local_138 = (undefined8 *)(lVar14 + (ulong)(lVar14 == 0));
        puVar21 = (undefined8 *)0x0;
        uVar12 = 0;
        local_158 = lVar14;
        do {
          if ((Vector *)local_140 != local_160) {
            lVar14 = 2;
            puVar17 = local_138;
            local_148 = puVar21;
            do {
              uVar18 = uVar12;
              if (**(long **)(local_168 + lVar14 * 8 + -0x10) != 0) {
                uVar18 = (ulong)*(uint *)(**(long **)(local_168 + lVar14 * 8 + -0x10) + uVar12 * 4);
              }
              if ((*(long *)(local_168 + lVar14 * 8) == 0) ||
                 ((*(ulong *)(*(long *)(local_168 + lVar14 * 8) + (uVar18 >> 6) * 8) >>
                   (uVar18 & 0x3f) & 1) != 0)) {
                *(undefined8 *)(lVar6 + (long)puVar21 * 8) =
                     *(undefined8 *)(*(long *)(local_168 + lVar14 * 8 + -8) + uVar18 * 8);
              }
              else {
                _Var10._M_head_impl = *(unsigned_long **)(pVVar7 + 0x28);
                if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                  local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start = *(pointer *)(pVVar7 + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_f8,(unsigned_long *)local_88);
                  p_Var4 = ap_Stack_f0[0];
                  uVar11 = local_f8;
                  local_f8 = 0;
                  ap_Stack_f0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38);
                  *(undefined8 *)(pVVar7 + 0x30) = uVar11;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38) = p_Var4;
                  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                     ap_Stack_f0[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_f0[0]);
                  }
                  pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                           operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                       *)local_150);
                  _Var10._M_head_impl =
                       (pTVar8->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)(pVVar7 + 0x28) = _Var10._M_head_impl;
                }
                bVar1 = (byte)puVar21 & 0x3f;
                _Var10._M_head_impl[(ulong)puVar21 >> 6] =
                     _Var10._M_head_impl[(ulong)puVar21 >> 6] &
                     (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
              }
              puVar21 = (undefined8 *)((long)puVar21 + 1);
              lVar14 = lVar14 + 9;
              puVar17 = (undefined8 *)((long)puVar17 + -1);
            } while (puVar17 != (undefined8 *)0x0);
            uVar18 = *(ulong *)(local_128 + 0x18);
            puVar21 = local_148;
            lVar14 = local_158;
          }
          *(ulong *)((long)local_130 + uVar12 * 0x10) = uVar12 * lVar14;
          *(long *)((long)local_130 + 8U + uVar12 * 0x10) = lVar14;
          uVar12 = uVar12 + 1;
          puVar21 = (undefined8 *)((long)puVar21 + lVar14);
        } while (uVar12 < uVar18);
      }
      duckdb::ListVector::SetListSize(local_120,uVar18 * lVar14);
      break;
    default:
switchD_0067b685_caseD_a:
      duckdb::ListType::GetChildType((LogicalType *)(result + 8));
      if (*(long *)(args + 0x18) == 0) {
        return;
      }
      local_148 = *(undefined8 **)(local_120 + 0x20);
      uVar18 = 0;
      do {
        puVar21 = local_148;
        uVar11 = duckdb::ListVector::GetListSize(local_120);
        local_150 = (Vector *)(uVar18 * 0x10);
        *(undefined8 *)(local_150 + (long)puVar21) = uVar11;
        if (*(long *)(args + 8) == *(long *)args) {
          uVar12 = 0;
        }
        else {
          uVar16 = 0;
          do {
            duckdb::DataChunk::GetValue((ulong)local_88,(ulong)local_128);
            duckdb::Value::DefaultCastAs((LogicalType *)&local_f8,SUB81((Value *)local_88,0));
            duckdb::Value::~Value((Value *)local_88);
            duckdb::ListVector::PushBack(local_120,(Value *)&local_f8);
            duckdb::Value::~Value((Value *)&local_f8);
            uVar16 = uVar16 + 1;
            uVar12 = (*(long *)(local_128 + 8) - *(long *)local_128 >> 3) * 0x4ec4ec4ec4ec4ec5;
          } while (uVar16 < uVar12);
        }
        *(ulong *)(local_150 + (long)local_148 + 8) = uVar12;
        uVar18 = uVar18 + 1;
        args = local_128;
      } while (uVar18 < *(ulong *)(local_128 + 0x18));
      return;
    case 0xb:
      local_160 = *(Vector **)args;
      local_140 = *(ulong *)(args + 8);
      lVar14 = ((long)(local_140 - (long)local_160) >> 3) * 0x4ec4ec4ec4ec4ec5;
      duckdb::ListVector::Reserve(result,*(long *)(args + 0x18) * lVar14);
      local_130 = *(Vector **)(result + 0x20);
      pVVar7 = (Vector *)duckdb::ListVector::GetEntry(result);
      lVar6 = *(long *)(pVVar7 + 0x20);
      FlatVector::VerifyFlatVector(pVVar7);
      duckdb::DataChunk::ToUnifiedFormat();
      uVar18 = *(ulong *)(args + 0x18);
      if (uVar18 == 0) {
        uVar18 = 0;
      }
      else {
        local_150 = pVVar7 + 0x30;
        local_138 = (undefined8 *)(lVar14 + (ulong)(lVar14 == 0));
        puVar21 = (undefined8 *)0x0;
        uVar12 = 0;
        local_158 = lVar14;
        do {
          if ((Vector *)local_140 != local_160) {
            lVar14 = 4;
            puVar17 = local_138;
            local_148 = puVar21;
            do {
              uVar18 = uVar12;
              if (**(long **)(local_168 + lVar14 * 4 + -0x10) != 0) {
                uVar18 = (ulong)*(uint *)(**(long **)(local_168 + lVar14 * 4 + -0x10) + uVar12 * 4);
              }
              if ((*(long *)(local_168 + lVar14 * 4) == 0) ||
                 ((*(ulong *)(*(long *)(local_168 + lVar14 * 4) + (uVar18 >> 6) * 8) >>
                   (uVar18 & 0x3f) & 1) != 0)) {
                *(undefined4 *)(lVar6 + (long)puVar21 * 4) =
                     *(undefined4 *)(*(long *)(local_168 + lVar14 * 4 + -8) + uVar18 * 4);
              }
              else {
                _Var10._M_head_impl = *(unsigned_long **)(pVVar7 + 0x28);
                if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                  local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start = *(pointer *)(pVVar7 + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_f8,(unsigned_long *)local_88);
                  p_Var4 = ap_Stack_f0[0];
                  uVar11 = local_f8;
                  local_f8 = 0;
                  ap_Stack_f0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38);
                  *(undefined8 *)(pVVar7 + 0x30) = uVar11;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38) = p_Var4;
                  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                     ap_Stack_f0[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_f0[0]);
                  }
                  pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                           operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                       *)local_150);
                  _Var10._M_head_impl =
                       (pTVar8->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)(pVVar7 + 0x28) = _Var10._M_head_impl;
                }
                bVar1 = (byte)puVar21 & 0x3f;
                _Var10._M_head_impl[(ulong)puVar21 >> 6] =
                     _Var10._M_head_impl[(ulong)puVar21 >> 6] &
                     (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
              }
              puVar21 = (undefined8 *)((long)puVar21 + 1);
              lVar14 = lVar14 + 0x12;
              puVar17 = (undefined8 *)((long)puVar17 + -1);
            } while (puVar17 != (undefined8 *)0x0);
            uVar18 = *(ulong *)(local_128 + 0x18);
            puVar21 = local_148;
            lVar14 = local_158;
          }
          *(ulong *)((long)local_130 + uVar12 * 0x10) = uVar12 * lVar14;
          *(long *)((long)local_130 + 8U + uVar12 * 0x10) = lVar14;
          uVar12 = uVar12 + 1;
          puVar21 = (undefined8 *)((long)puVar21 + lVar14);
        } while (uVar12 < uVar18);
      }
      duckdb::ListVector::SetListSize(local_120,uVar18 * lVar14);
      break;
    case 0xc:
      local_160 = *(Vector **)args;
      local_140 = *(ulong *)(args + 8);
      lVar14 = ((long)(local_140 - (long)local_160) >> 3) * 0x4ec4ec4ec4ec4ec5;
      duckdb::ListVector::Reserve(result,*(long *)(args + 0x18) * lVar14);
      local_130 = *(Vector **)(result + 0x20);
      pVVar7 = (Vector *)duckdb::ListVector::GetEntry(result);
      lVar6 = *(long *)(pVVar7 + 0x20);
      FlatVector::VerifyFlatVector(pVVar7);
      duckdb::DataChunk::ToUnifiedFormat();
      uVar18 = *(ulong *)(args + 0x18);
      if (uVar18 == 0) {
        uVar18 = 0;
      }
      else {
        local_150 = pVVar7 + 0x30;
        local_138 = (undefined8 *)(lVar14 + (ulong)(lVar14 == 0));
        puVar21 = (undefined8 *)0x0;
        uVar12 = 0;
        local_158 = lVar14;
        do {
          if ((Vector *)local_140 != local_160) {
            lVar14 = 2;
            puVar17 = local_138;
            local_148 = puVar21;
            do {
              uVar18 = uVar12;
              if (**(long **)(local_168 + lVar14 * 8 + -0x10) != 0) {
                uVar18 = (ulong)*(uint *)(**(long **)(local_168 + lVar14 * 8 + -0x10) + uVar12 * 4);
              }
              if ((*(long *)(local_168 + lVar14 * 8) == 0) ||
                 ((*(ulong *)(*(long *)(local_168 + lVar14 * 8) + (uVar18 >> 6) * 8) >>
                   (uVar18 & 0x3f) & 1) != 0)) {
                *(undefined8 *)(lVar6 + (long)puVar21 * 8) =
                     *(undefined8 *)(*(long *)(local_168 + lVar14 * 8 + -8) + uVar18 * 8);
              }
              else {
                _Var10._M_head_impl = *(unsigned_long **)(pVVar7 + 0x28);
                if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                  local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start = *(pointer *)(pVVar7 + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_f8,(unsigned_long *)local_88);
                  p_Var4 = ap_Stack_f0[0];
                  uVar11 = local_f8;
                  local_f8 = 0;
                  ap_Stack_f0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38);
                  *(undefined8 *)(pVVar7 + 0x30) = uVar11;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38) = p_Var4;
                  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                     ap_Stack_f0[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_f0[0]);
                  }
                  pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                           operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                       *)local_150);
                  _Var10._M_head_impl =
                       (pTVar8->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)(pVVar7 + 0x28) = _Var10._M_head_impl;
                }
                bVar1 = (byte)puVar21 & 0x3f;
                _Var10._M_head_impl[(ulong)puVar21 >> 6] =
                     _Var10._M_head_impl[(ulong)puVar21 >> 6] &
                     (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
              }
              puVar21 = (undefined8 *)((long)puVar21 + 1);
              lVar14 = lVar14 + 9;
              puVar17 = (undefined8 *)((long)puVar17 + -1);
            } while (puVar17 != (undefined8 *)0x0);
            uVar18 = *(ulong *)(local_128 + 0x18);
            puVar21 = local_148;
            lVar14 = local_158;
          }
          *(ulong *)((long)local_130 + uVar12 * 0x10) = uVar12 * lVar14;
          *(long *)((long)local_130 + 8U + uVar12 * 0x10) = lVar14;
          uVar12 = uVar12 + 1;
          puVar21 = (undefined8 *)((long)puVar21 + lVar14);
        } while (uVar12 < uVar18);
      }
      duckdb::ListVector::SetListSize(local_120,uVar18 * lVar14);
      break;
    case 0x15:
      local_140 = *(ulong *)args;
      local_130 = *(Vector **)(args + 8);
      lVar14 = (long)((long)local_130 - local_140) >> 3;
      lVar6 = lVar14 * 0x4ec4ec4ec4ec4ec5;
      duckdb::ListVector::Reserve(result,*(long *)(args + 0x18) * lVar6);
      local_138 = *(undefined8 **)(result + 0x20);
      pVVar7 = (Vector *)duckdb::ListVector::GetEntry(result);
      puVar21 = *(undefined8 **)(pVVar7 + 0x20);
      FlatVector::VerifyFlatVector(pVVar7);
      duckdb::DataChunk::ToUnifiedFormat();
      uVar18 = *(ulong *)(args + 0x18);
      if (uVar18 == 0) {
        uVar18 = 0;
      }
      else {
        local_150 = pVVar7 + 0x30;
        local_110 = lVar6 + (ulong)(lVar6 == 0);
        local_158 = lVar14 * -0x13b13b13b13b13b0;
        pVVar19 = (Vector *)0x0;
        uVar12 = 0;
        local_118 = lVar6;
        do {
          if (local_130 != (Vector *)local_140) {
            lVar14 = 0x10;
            lVar6 = local_110;
            local_160 = pVVar19;
            local_148 = puVar21;
            do {
              uVar18 = uVar12;
              if (**(long **)(local_168 + lVar14 + -0x10) != 0) {
                uVar18 = (ulong)*(uint *)(**(long **)(local_168 + lVar14 + -0x10) + uVar12 * 4);
              }
              if ((*(long *)(local_168 + lVar14) == 0) ||
                 ((*(ulong *)(*(long *)(local_168 + lVar14) + (uVar18 >> 6) * 8) >> (uVar18 & 0x3f)
                  & 1) != 0)) {
                puVar17 = (undefined8 *)(*(long *)(local_168 + lVar14 + -8) + uVar18 * 0x10);
                uVar11 = puVar17[1];
                *puVar21 = *puVar17;
                puVar21[1] = uVar11;
              }
              else {
                _Var10._M_head_impl = *(unsigned_long **)(pVVar7 + 0x28);
                if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                  local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start = *(pointer *)(pVVar7 + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_f8,(unsigned_long *)local_88);
                  p_Var4 = ap_Stack_f0[0];
                  uVar11 = local_f8;
                  local_f8 = 0;
                  ap_Stack_f0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38);
                  *(undefined8 *)(pVVar7 + 0x30) = uVar11;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38) = p_Var4;
                  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                     ap_Stack_f0[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_f0[0]);
                  }
                  pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                           operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                       *)local_150);
                  _Var10._M_head_impl =
                       (pTVar8->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)(pVVar7 + 0x28) = _Var10._M_head_impl;
                }
                bVar1 = (byte)pVVar19 & 0x3f;
                _Var10._M_head_impl[(ulong)pVVar19 >> 6] =
                     _Var10._M_head_impl[(ulong)pVVar19 >> 6] &
                     (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
              }
              pVVar19 = (Vector *)((long)pVVar19 + 1);
              puVar21 = puVar21 + 2;
              lVar14 = lVar14 + 0x48;
              lVar6 = lVar6 + -1;
            } while (lVar6 != 0);
            uVar18 = *(ulong *)(local_128 + 0x18);
            lVar6 = local_118;
            pVVar19 = local_160;
            puVar21 = local_148;
          }
          local_138[uVar12 * 2] = uVar12 * lVar6;
          local_138[uVar12 * 2 + 1] = lVar6;
          uVar12 = uVar12 + 1;
          pVVar19 = (Vector *)((long)pVVar19 + lVar6);
          puVar21 = (undefined8 *)((long)puVar21 + local_158);
        } while (uVar12 < uVar18);
      }
      duckdb::ListVector::SetListSize(local_120,uVar18 * lVar6);
      break;
    case 0x17:
      lVar6 = *(long *)args;
      lVar14 = *(long *)(args + 8);
      local_158 = (lVar14 - lVar6 >> 3) * 0x4ec4ec4ec4ec4ec5;
      duckdb::ListVector::Reserve(result,*(long *)(args + 0x18) * local_158);
      local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
      local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
      local_100 = 0;
      local_118 = lVar14;
      local_110 = lVar6;
      if (lVar14 != lVar6) {
        sVar13 = local_158 + (ulong)(local_158 == 0);
        sVar20 = 0;
        do {
          if (local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_88,
                       (iterator)
                       local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_100);
          }
          else {
            *local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_100;
            local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          pvVar5 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)args,sVar20);
          lVar6 = duckdb::ListVector::GetListSize(pvVar5);
          local_100 = lVar6 + local_100;
          sVar20 = sVar20 + 1;
        } while (sVar13 != sVar20);
      }
      pVVar7 = local_120;
      pVVar19 = (Vector *)duckdb::ListVector::GetEntry(local_120);
      duckdb::ListVector::Reserve(pVVar19,local_100);
      local_160 = pVVar19;
      local_150 = (Vector *)duckdb::ListVector::GetEntry(pVVar19);
      if (local_118 != local_110) {
        sVar20 = local_158 + (ulong)(local_158 == 0);
        sVar13 = 0;
        do {
          pvVar5 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)local_128,sVar13);
          duckdb::Vector::Vector((Vector *)&local_f8,pvVar5);
          uVar18 = duckdb::ListVector::GetListSize((Vector *)&local_f8);
          if (uVar18 != 0) {
            pVVar19 = (Vector *)duckdb::ListVector::GetEntry((Vector *)&local_f8);
            pvVar9 = vector<unsigned_long,_true>::operator[](local_88,sVar13);
            duckdb::VectorOperations::Copy(pVVar19,local_150,uVar18,0,*pvVar9);
          }
          if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
          }
          if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
          }
          if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
          }
          duckdb::LogicalType::~LogicalType((LogicalType *)ap_Stack_f0);
          sVar13 = sVar13 + 1;
        } while (sVar20 != sVar13);
      }
      local_38 = *(long *)(pVVar7 + 0x20);
      lVar6 = *(long *)(local_160 + 0x20);
      FlatVector::VerifyFlatVector(local_160);
      pDVar3 = local_128;
      duckdb::DataChunk::ToUnifiedFormat();
      uVar18 = *(ulong *)(pDVar3 + 0x18);
      if (uVar18 == 0) {
        uVar18 = 0;
      }
      else {
        local_130 = local_160 + 0x30;
        local_148 = (undefined8 *)(local_158 + (ulong)(local_158 == 0));
        puVar21 = (undefined8 *)(lVar6 + 8);
        local_40 = local_158 << 4;
        local_140 = 0;
        uVar12 = 0;
        do {
          if (local_118 != local_110) {
            pVVar7 = (Vector *)0x10;
            puVar17 = (undefined8 *)0x0;
            local_138 = puVar21;
            do {
              pVVar19 = local_160;
              uVar18 = uVar12;
              if (**(long **)(local_108 + -0x10 + (long)pVVar7) != 0) {
                uVar18 = (ulong)*(uint *)(**(long **)(local_108 + -0x10 + (long)pVVar7) + uVar12 * 4
                                         );
              }
              lVar6 = *(long *)(local_108 + -8 + (long)pVVar7);
              if ((*(long *)(local_108 + (long)pVVar7) == 0) ||
                 ((*(ulong *)(*(long *)(local_108 + (long)pVVar7) + (uVar18 >> 6) * 8) >>
                   (uVar18 & 0x3f) & 1) != 0)) {
                uVar11 = *(undefined8 *)(lVar6 + 8 + uVar18 * 0x10);
                local_150 = pVVar7;
                pvVar9 = vector<unsigned_long,_true>::operator[](local_88,(size_type)puVar17);
                puVar21[-1] = *(long *)(lVar6 + uVar18 * 0x10) + *pvVar9;
                *puVar21 = uVar11;
                pVVar7 = local_150;
              }
              else {
                _Var10._M_head_impl = *(unsigned_long **)(local_160 + 0x28);
                if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                  local_168 = *(UnifiedVectorFormat **)(local_160 + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_f8,(unsigned_long *)&local_168);
                  p_Var4 = ap_Stack_f0[0];
                  uVar11 = local_f8;
                  local_f8 = 0;
                  ap_Stack_f0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar19 + 0x38);
                  *(undefined8 *)(pVVar19 + 0x30) = uVar11;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar19 + 0x38) = p_Var4;
                  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                     ap_Stack_f0[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_f0[0]);
                  }
                  pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                           operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                       *)local_130);
                  _Var10._M_head_impl =
                       (pTVar8->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)(local_160 + 0x28) = _Var10._M_head_impl;
                }
                bVar1 = (byte)(local_140 + (long)puVar17) & 0x3f;
                _Var10._M_head_impl[local_140 + (long)puVar17 >> 6] =
                     _Var10._M_head_impl[local_140 + (long)puVar17 >> 6] &
                     (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
              }
              puVar17 = (undefined8 *)((long)puVar17 + 1);
              puVar21 = puVar21 + 2;
              pVVar7 = pVVar7 + 0x48;
            } while (local_148 != puVar17);
            uVar18 = *(ulong *)(local_128 + 0x18);
            puVar21 = local_138;
            pVVar7 = local_120;
          }
          *(ulong *)(local_38 + uVar12 * 0x10) = uVar12 * local_158;
          *(long *)(local_38 + 8 + uVar12 * 0x10) = local_158;
          uVar12 = uVar12 + 1;
          local_140 = local_140 + local_158;
          puVar21 = (undefined8 *)((long)puVar21 + local_40);
        } while (uVar12 < uVar18);
      }
      duckdb::ListVector::SetListSize(pVVar7,uVar18 * local_158);
      duckdb::ListVector::SetListSize(local_160,local_100);
      if (local_108 != (UnifiedVectorFormat *)0x0) {
        std::default_delete<duckdb::UnifiedVectorFormat[]>::operator()
                  ((default_delete<duckdb::UnifiedVectorFormat[]> *)&local_108,local_108);
      }
      if (local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return;
      }
      operator_delete(local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
      return;
    }
  }
  else if (bVar1 == 200) {
    local_140 = *(ulong *)args;
    local_130 = *(Vector **)(args + 8);
    lVar15 = (long)((long)local_130 - local_140) >> 3;
    lVar14 = lVar15 * 0x4ec4ec4ec4ec4ec5;
    duckdb::ListVector::Reserve(result,*(long *)(args + 0x18) * lVar14);
    local_138 = *(undefined8 **)(result + 0x20);
    pVVar7 = (Vector *)duckdb::ListVector::GetEntry(result);
    lVar6 = *(long *)(pVVar7 + 0x20);
    FlatVector::VerifyFlatVector(pVVar7);
    duckdb::DataChunk::ToUnifiedFormat();
    uVar18 = *(ulong *)(args + 0x18);
    if (uVar18 == 0) {
      uVar18 = 0;
    }
    else {
      local_150 = pVVar7 + 0x30;
      local_110 = lVar14 + (ulong)(lVar14 == 0);
      puVar21 = (undefined8 *)(lVar6 + 8);
      local_158 = lVar15 * -0x13b13b13b13b13b0;
      pVVar19 = (Vector *)0x0;
      uVar12 = 0;
      local_118 = lVar14;
      do {
        if (local_130 != (Vector *)local_140) {
          lVar14 = 0x10;
          lVar6 = local_110;
          local_160 = pVVar19;
          local_148 = puVar21;
          do {
            uVar18 = uVar12;
            if (**(long **)(local_168 + lVar14 + -0x10) != 0) {
              uVar18 = (ulong)*(uint *)(**(long **)(local_168 + lVar14 + -0x10) + uVar12 * 4);
            }
            if ((*(long *)(local_168 + lVar14) == 0) ||
               ((*(ulong *)(*(long *)(local_168 + lVar14) + (uVar18 >> 6) * 8) >> (uVar18 & 0x3f) &
                1) != 0)) {
              sVar22.value.pointer.ptr =
                   (char *)*(undefined8 *)(*(long *)(local_168 + lVar14 + -8) + 8 + uVar18 * 0x10);
              sVar22.value._0_8_ =
                   *(undefined8 *)(*(long *)(local_168 + lVar14 + -8) + uVar18 * 0x10);
              auVar23 = duckdb::StringVector::AddStringOrBlob(pVVar7,sVar22);
              puVar21[-1] = auVar23._0_8_;
              *puVar21 = auVar23._8_8_;
            }
            else {
              _Var10._M_head_impl = *(unsigned_long **)(pVVar7 + 0x28);
              if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start = *(pointer *)(pVVar7 + 0x40);
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_f8,(unsigned_long *)local_88);
                p_Var4 = ap_Stack_f0[0];
                uVar11 = local_f8;
                local_f8 = 0;
                ap_Stack_f0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38);
                *(undefined8 *)(pVVar7 + 0x30) = uVar11;
                *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38) = p_Var4;
                if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                   ap_Stack_f0[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_f0[0]);
                }
                pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                   ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                     *)local_150);
                _Var10._M_head_impl =
                     (pTVar8->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                *(unsigned_long **)(pVVar7 + 0x28) = _Var10._M_head_impl;
              }
              bVar1 = (byte)pVVar19 & 0x3f;
              _Var10._M_head_impl[(ulong)pVVar19 >> 6] =
                   _Var10._M_head_impl[(ulong)pVVar19 >> 6] &
                   (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
            }
            pVVar19 = (Vector *)((long)pVVar19 + 1);
            puVar21 = puVar21 + 2;
            lVar14 = lVar14 + 0x48;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
          uVar18 = *(ulong *)(local_128 + 0x18);
          lVar14 = local_118;
          pVVar19 = local_160;
          puVar21 = local_148;
        }
        local_138[uVar12 * 2] = uVar12 * lVar14;
        local_138[uVar12 * 2 + 1] = lVar14;
        uVar12 = uVar12 + 1;
        pVVar19 = (Vector *)((long)pVVar19 + lVar14);
        puVar21 = (undefined8 *)((long)puVar21 + local_158);
      } while (uVar12 < uVar18);
    }
    duckdb::ListVector::SetListSize(local_120,uVar18 * lVar14);
  }
  else if (bVar1 == 0xcb) {
    local_140 = *(ulong *)args;
    local_130 = *(Vector **)(args + 8);
    lVar14 = (long)((long)local_130 - local_140) >> 3;
    lVar6 = lVar14 * 0x4ec4ec4ec4ec4ec5;
    duckdb::ListVector::Reserve(result,*(long *)(args + 0x18) * lVar6);
    local_138 = *(undefined8 **)(result + 0x20);
    pVVar7 = (Vector *)duckdb::ListVector::GetEntry(result);
    puVar21 = *(undefined8 **)(pVVar7 + 0x20);
    FlatVector::VerifyFlatVector(pVVar7);
    duckdb::DataChunk::ToUnifiedFormat();
    uVar18 = *(ulong *)(args + 0x18);
    if (uVar18 == 0) {
      uVar18 = 0;
    }
    else {
      local_150 = pVVar7 + 0x30;
      local_110 = lVar6 + (ulong)(lVar6 == 0);
      local_158 = lVar14 * -0x13b13b13b13b13b0;
      pVVar19 = (Vector *)0x0;
      uVar12 = 0;
      local_118 = lVar6;
      do {
        if (local_130 != (Vector *)local_140) {
          lVar14 = 0x10;
          lVar6 = local_110;
          local_160 = pVVar19;
          local_148 = puVar21;
          do {
            uVar18 = uVar12;
            if (**(long **)(local_168 + lVar14 + -0x10) != 0) {
              uVar18 = (ulong)*(uint *)(**(long **)(local_168 + lVar14 + -0x10) + uVar12 * 4);
            }
            if ((*(long *)(local_168 + lVar14) == 0) ||
               ((*(ulong *)(*(long *)(local_168 + lVar14) + (uVar18 >> 6) * 8) >> (uVar18 & 0x3f) &
                1) != 0)) {
              puVar17 = (undefined8 *)(*(long *)(local_168 + lVar14 + -8) + uVar18 * 0x10);
              uVar11 = puVar17[1];
              *puVar21 = *puVar17;
              puVar21[1] = uVar11;
            }
            else {
              _Var10._M_head_impl = *(unsigned_long **)(pVVar7 + 0x28);
              if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start = *(pointer *)(pVVar7 + 0x40);
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_f8,(unsigned_long *)local_88);
                p_Var4 = ap_Stack_f0[0];
                uVar11 = local_f8;
                local_f8 = 0;
                ap_Stack_f0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38);
                *(undefined8 *)(pVVar7 + 0x30) = uVar11;
                *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38) = p_Var4;
                if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                   ap_Stack_f0[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_f0[0]);
                }
                pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                   ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                     *)local_150);
                _Var10._M_head_impl =
                     (pTVar8->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                *(unsigned_long **)(pVVar7 + 0x28) = _Var10._M_head_impl;
              }
              bVar1 = (byte)pVVar19 & 0x3f;
              _Var10._M_head_impl[(ulong)pVVar19 >> 6] =
                   _Var10._M_head_impl[(ulong)pVVar19 >> 6] &
                   (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
            }
            pVVar19 = (Vector *)((long)pVVar19 + 1);
            puVar21 = puVar21 + 2;
            lVar14 = lVar14 + 0x48;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
          uVar18 = *(ulong *)(local_128 + 0x18);
          lVar6 = local_118;
          pVVar19 = local_160;
          puVar21 = local_148;
        }
        local_138[uVar12 * 2] = uVar12 * lVar6;
        local_138[uVar12 * 2 + 1] = lVar6;
        uVar12 = uVar12 + 1;
        pVVar19 = (Vector *)((long)pVVar19 + lVar6);
        puVar21 = (undefined8 *)((long)puVar21 + local_158);
      } while (uVar12 < uVar18);
    }
    duckdb::ListVector::SetListSize(local_120,uVar18 * lVar6);
  }
  else {
    if (bVar1 != 0xcc) goto switchD_0067b685_caseD_a;
    local_140 = *(ulong *)args;
    local_130 = *(Vector **)(args + 8);
    lVar14 = (long)((long)local_130 - local_140) >> 3;
    lVar6 = lVar14 * 0x4ec4ec4ec4ec4ec5;
    duckdb::ListVector::Reserve(result,*(long *)(args + 0x18) * lVar6);
    local_138 = *(undefined8 **)(result + 0x20);
    pVVar7 = (Vector *)duckdb::ListVector::GetEntry(result);
    puVar21 = *(undefined8 **)(pVVar7 + 0x20);
    FlatVector::VerifyFlatVector(pVVar7);
    duckdb::DataChunk::ToUnifiedFormat();
    uVar18 = *(ulong *)(args + 0x18);
    if (uVar18 == 0) {
      uVar18 = 0;
    }
    else {
      local_150 = pVVar7 + 0x30;
      local_110 = lVar6 + (ulong)(lVar6 == 0);
      local_158 = lVar14 * -0x13b13b13b13b13b0;
      pVVar19 = (Vector *)0x0;
      uVar12 = 0;
      local_118 = lVar6;
      do {
        if (local_130 != (Vector *)local_140) {
          lVar14 = 0x10;
          lVar6 = local_110;
          local_160 = pVVar19;
          local_148 = puVar21;
          do {
            uVar18 = uVar12;
            if (**(long **)(local_168 + lVar14 + -0x10) != 0) {
              uVar18 = (ulong)*(uint *)(**(long **)(local_168 + lVar14 + -0x10) + uVar12 * 4);
            }
            if ((*(long *)(local_168 + lVar14) == 0) ||
               ((*(ulong *)(*(long *)(local_168 + lVar14) + (uVar18 >> 6) * 8) >> (uVar18 & 0x3f) &
                1) != 0)) {
              puVar17 = (undefined8 *)(*(long *)(local_168 + lVar14 + -8) + uVar18 * 0x10);
              uVar11 = puVar17[1];
              *puVar21 = *puVar17;
              puVar21[1] = uVar11;
            }
            else {
              _Var10._M_head_impl = *(unsigned_long **)(pVVar7 + 0x28);
              if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                local_88[0].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start = *(pointer *)(pVVar7 + 0x40);
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_f8,(unsigned_long *)local_88);
                p_Var4 = ap_Stack_f0[0];
                uVar11 = local_f8;
                local_f8 = 0;
                ap_Stack_f0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38);
                *(undefined8 *)(pVVar7 + 0x30) = uVar11;
                *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar7 + 0x38) = p_Var4;
                if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                   ap_Stack_f0[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_f0[0]);
                }
                pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                   ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                     *)local_150);
                _Var10._M_head_impl =
                     (pTVar8->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                *(unsigned_long **)(pVVar7 + 0x28) = _Var10._M_head_impl;
              }
              bVar1 = (byte)pVVar19 & 0x3f;
              _Var10._M_head_impl[(ulong)pVVar19 >> 6] =
                   _Var10._M_head_impl[(ulong)pVVar19 >> 6] &
                   (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
            }
            pVVar19 = (Vector *)((long)pVVar19 + 1);
            puVar21 = puVar21 + 2;
            lVar14 = lVar14 + 0x48;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
          uVar18 = *(ulong *)(local_128 + 0x18);
          lVar6 = local_118;
          pVVar19 = local_160;
          puVar21 = local_148;
        }
        local_138[uVar12 * 2] = uVar12 * lVar6;
        local_138[uVar12 * 2 + 1] = lVar6;
        uVar12 = uVar12 + 1;
        pVVar19 = (Vector *)((long)pVVar19 + lVar6);
        puVar21 = (undefined8 *)((long)puVar21 + local_158);
      } while (uVar12 < uVar18);
    }
    duckdb::ListVector::SetListSize(local_120,uVar18 * lVar6);
  }
  if (local_168 != (UnifiedVectorFormat *)0x0) {
    std::default_delete<duckdb::UnifiedVectorFormat[]>::operator()
              ((default_delete<duckdb::UnifiedVectorFormat[]> *)&local_168,local_168);
  }
  return;
}

Assistant:

static void ListValueFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	if (args.ColumnCount() == 0) {
		// no columns - early out - result is a constant empty list
		auto result_data = FlatVector::GetData<list_entry_t>(result);
		result_data[0].length = 0;
		result_data[0].offset = 0;
		return;
	}
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		if (args.data[i].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::FLAT_VECTOR);
		}
	}
	auto &result_type = ListVector::GetEntry(result).GetType();
	switch (result_type.InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedListValueFunction<int8_t>(args, result);
		break;
	case PhysicalType::INT16:
		TemplatedListValueFunction<int16_t>(args, result);
		break;
	case PhysicalType::INT32:
		TemplatedListValueFunction<int32_t>(args, result);
		break;
	case PhysicalType::INT64:
		TemplatedListValueFunction<int64_t>(args, result);
		break;
	case PhysicalType::UINT8:
		TemplatedListValueFunction<uint8_t>(args, result);
		break;
	case PhysicalType::UINT16:
		TemplatedListValueFunction<uint16_t>(args, result);
		break;
	case PhysicalType::UINT32:
		TemplatedListValueFunction<uint32_t>(args, result);
		break;
	case PhysicalType::UINT64:
		TemplatedListValueFunction<uint64_t>(args, result);
		break;
	case PhysicalType::INT128:
		TemplatedListValueFunction<hugeint_t>(args, result);
		break;
	case PhysicalType::UINT128:
		TemplatedListValueFunction<uhugeint_t>(args, result);
		break;
	case PhysicalType::FLOAT:
		TemplatedListValueFunction<float>(args, result);
		break;
	case PhysicalType::DOUBLE:
		TemplatedListValueFunction<double>(args, result);
		break;
	case PhysicalType::INTERVAL:
		TemplatedListValueFunction<interval_t>(args, result);
		break;
	case PhysicalType::VARCHAR:
		TemplatedListValueFunction<string_t, ListValueStringAssign>(args, result);
		break;
	case PhysicalType::LIST:
		ListValueListFunction(args, result);
		break;
	default: {
		TemplatedListValueFunctionFallback(args, result);
		break;
	}
	}
}